

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifLibBox.c
# Opt level: O3

If_LibBox_t * If_LibBoxRead2(char *pFileName)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  FILE *__stream;
  char *__s;
  char *pcVar5;
  size_t sVar6;
  If_Box_t *pBox;
  int *piVar7;
  If_Box_t *pIVar8;
  ulong uVar9;
  char *__dest;
  char local_60;
  If_LibBox_t *local_58;
  char local_50;
  char local_48;
  
  __stream = fopen(pFileName,"rb");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open file \"%s\".\n",pFileName);
    return (If_LibBox_t *)0x0;
  }
  __s = (char *)malloc(100000);
  local_58 = (If_LibBox_t *)0x0;
  pBox = (If_Box_t *)0x0;
  iVar2 = 0;
  iVar3 = 0;
  do {
    do {
      while( true ) {
        do {
          pIVar8 = pBox;
          pcVar5 = fgets(__s,100000,__stream);
          if (pcVar5 == (char *)0x0) {
            if (__s != (char *)0x0) {
              free(__s);
            }
            fclose(__stream);
            return local_58;
          }
          pcVar5 = strtok(__s," \n\r\t");
          pBox = pIVar8;
        } while (pcVar5 == (char *)0x0);
        if (*pcVar5 == '.') break;
        if (iVar3 < 1 || iVar2 < 1) {
          __assert_fail("nPis > 0 && nPos > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifLibBox.c"
                        ,0xe0,"If_LibBox_t *If_LibBoxRead2(char *)");
        }
        pBox = (If_Box_t *)0x0;
        if (0 < iVar3 * iVar2) {
          uVar9 = 0;
          do {
            while (pcVar5 == (char *)0x0) {
              pcVar5 = fgets(__s,100000,__stream);
              if (pcVar5 == (char *)0x0) {
                puts("The table does not have enough entries.");
                fflush(_stdout);
              }
              pcVar5 = strtok(__s," \n\r\t");
            }
            iVar1 = -1;
            if (*pcVar5 != '-') {
              iVar1 = atoi(pcVar5);
            }
            pIVar8->pDelays[uVar9] = iVar1;
            pcVar5 = strtok((char *)0x0," \n\r\t");
            uVar9 = uVar9 + 1;
            pBox = (If_Box_t *)0x0;
          } while (uVar9 != (uint)(iVar3 * iVar2));
        }
      }
      iVar1 = strcmp(pcVar5,".box");
    } while (iVar1 != 0);
    pcVar5 = strtok((char *)0x0," \n\r\t");
    iVar1 = atoi(pcVar5);
    pcVar5 = strtok((char *)0x0," \n\r\t");
    __dest = (char *)0x0;
    if (pcVar5 != (char *)0x0) {
      sVar6 = strlen(pcVar5);
      __dest = (char *)malloc(sVar6 + 1);
      strcpy(__dest,pcVar5);
    }
    pcVar5 = strtok((char *)0x0," \n\r\t");
    iVar2 = atoi(pcVar5);
    pcVar5 = strtok((char *)0x0," \n\r\t");
    iVar3 = atoi(pcVar5);
    pcVar5 = strtok((char *)0x0," \n\r\t");
    if (pcVar5 == (char *)0x0) {
      local_60 = '\0';
      local_48 = '\0';
      local_50 = '\0';
    }
    else {
      local_50 = '\0';
      local_48 = '\0';
      local_60 = '\0';
      do {
        iVar4 = strcmp(pcVar5,"seq");
        if (iVar4 == 0) {
          local_60 = '\x01';
        }
        else {
          iVar4 = strcmp(pcVar5,"black");
          if (iVar4 == 0) {
            local_48 = '\x01';
          }
          else {
            iVar4 = strcmp(pcVar5,"outer");
            if (iVar4 == 0) {
              local_50 = '\x01';
            }
            else {
              iVar4 = strcmp(pcVar5,"comb");
              if (((iVar4 != 0) && (iVar4 = strcmp(pcVar5,"white"), iVar4 != 0)) &&
                 (iVar4 = strcmp(pcVar5,"inner"), iVar4 != 0)) {
                __assert_fail("!strcmp(pToken, \"comb\") || !strcmp(pToken, \"white\") || !strcmp(pToken, \"inner\")"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifLibBox.c"
                              ,0xd3,"If_LibBox_t *If_LibBoxRead2(char *)");
              }
            }
          }
        }
        pcVar5 = strtok((char *)0x0," \n\r\t");
      } while (pcVar5 != (char *)0x0);
    }
    if (local_58 == (If_LibBox_t *)0x0) {
      local_58 = If_LibBoxStart();
    }
    pBox = (If_Box_t *)calloc(1,0x20);
    pBox->pName = __dest;
    pBox->Id = iVar1;
    pBox->fSeq = local_60;
    pBox->fBlack = local_48;
    pBox->fOuter = local_50;
    pBox->nPis = iVar2;
    pBox->nPos = iVar3;
    piVar7 = (int *)calloc((long)(iVar3 * iVar2),4);
    pBox->pDelays = piVar7;
    If_LibBoxAdd(local_58,pBox);
  } while( true );
}

Assistant:

If_LibBox_t * If_LibBoxRead2( char * pFileName )
{
    int nSize = 100000;
    char * pBuffer;
    FILE * pFile;
    If_LibBox_t * p = NULL;
    If_Box_t * pBox = NULL;
    char * pToken, * pName;
    int fSeq, fBlack, fOuter;
    int i, Id, nPis, nPos;
    pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\".\n", pFileName );
        return NULL;
    }
    // read lines
    nPis = nPos = 0;
    pBuffer = ABC_ALLOC( char, nSize );
    while ( fgets( pBuffer, nSize, pFile ) )
    {
        pToken = strtok( pBuffer, " \n\r\t" );
        if ( pToken == NULL )
            continue;
        if ( pToken[0] == '.' )
        {
            if ( !strcmp(pToken, ".box") )
            {
                // save ID
                pToken = strtok( NULL, " \n\r\t" );
                Id     = atoi( pToken );
                // save name
                pToken = strtok( NULL, " \n\r\t" );
                pName  = Abc_UtilStrsav(pToken);
                // save PIs
                pToken = strtok( NULL, " \n\r\t" );
                nPis   = atoi( pToken );
                // save POs
                pToken = strtok( NULL, " \n\r\t" );
                nPos   = atoi( pToken );
                // save attributes
                fSeq = fBlack = fOuter = 0;
                pToken = strtok( NULL, " \n\r\t" );
                while ( pToken )
                {
                    if ( !strcmp(pToken, "seq") )
                        fSeq = 1;
                    else if ( !strcmp(pToken, "black") )
                        fBlack = 1;
                    else if ( !strcmp(pToken, "outer") )
                        fOuter = 1;
                    else assert( !strcmp(pToken, "comb") || !strcmp(pToken, "white") || !strcmp(pToken, "inner") );
                    pToken = strtok( NULL, " \n\r\t" );
                }
                // create library
                if ( p == NULL )
                    p = If_LibBoxStart();
                // create box
                pBox = If_BoxStart( pName, Id, nPis, nPos, fSeq, fBlack, fOuter );
                If_LibBoxAdd( p, pBox );
            }
            continue;
        }
        // read the table
        assert( nPis > 0 && nPos > 0 );
        for ( i = 0; i < nPis * nPos; i++ )
        {
            while ( pToken == NULL )
            {
                if ( fgets( pBuffer, nSize, pFile ) == NULL )
                { printf( "The table does not have enough entries.\n" ); fflush(stdout); assert( 0 ); }
                pToken = strtok( pBuffer, " \n\r\t" );
            }
            pBox->pDelays[i] = (pToken[0] == '-') ? -1 : atoi(pToken);
            pToken = strtok( NULL, " \n\r\t" );
        }
        pBox = NULL;
    }
    ABC_FREE( pBuffer );
    fclose( pFile );
    return p;
}